

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall Catch::JsonValueWriter::writeImpl(JsonValueWriter *this,StringRef value,bool quote)

{
  char cVar1;
  undefined8 in_RAX;
  undefined7 in_register_00000009;
  long lVar2;
  char *pcVar3;
  size_type sVar4;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  if ((int)CONCAT71(in_register_00000009,quote) != 0) {
    uStack_38._7_1_ = (undefined1)((ulong)in_RAX >> 0x38);
    uStack_38._0_6_ = (undefined6)in_RAX;
    uStack_38._0_7_ = CONCAT16(0x22,(undefined6)uStack_38);
    std::__ostream_insert<char,std::char_traits<char>>(this->m_os,(char *)((long)&uStack_38 + 6),1);
  }
  if (value.m_size != 0) {
    sVar4 = 0;
    do {
      cVar1 = value.m_start[sVar4];
      switch(cVar1) {
      case '\b':
        lVar2 = 2;
        pcVar3 = "\\b";
        break;
      case '\t':
        lVar2 = 2;
        pcVar3 = "\\t";
        break;
      case '\n':
        lVar2 = 2;
        pcVar3 = "\\n";
        break;
      case '\v':
switchD_001463e5_caseD_b:
        uStack_38._0_6_ = CONCAT15(cVar1,(undefined5)uStack_38);
        lVar2 = 1;
        pcVar3 = (char *)((long)&uStack_38 + 5);
        break;
      case '\f':
        lVar2 = 2;
        pcVar3 = "\\f";
        break;
      case '\r':
        lVar2 = 2;
        pcVar3 = "\\r";
        break;
      default:
        if (cVar1 == '\\') {
          lVar2 = 2;
          pcVar3 = "\\\\";
        }
        else {
          if (cVar1 != '\"') goto switchD_001463e5_caseD_b;
          lVar2 = 2;
          pcVar3 = "\\\"";
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>(this->m_os,pcVar3,lVar2);
      sVar4 = sVar4 + 1;
    } while (value.m_size != sVar4);
  }
  if (quote) {
    uStack_38 = CONCAT17(0x22,(undefined7)uStack_38);
    std::__ostream_insert<char,std::char_traits<char>>(this->m_os,(char *)((long)&uStack_38 + 7),1);
  }
  return;
}

Assistant:

void JsonValueWriter::writeImpl( Catch::StringRef value, bool quote ) {
        if ( quote ) { m_os << '"'; }
        for (char c : value) {
            // Escape list taken from https://www.json.org/json-en.html,
            // string definition.
            // Note that while forward slash _can_ be escaped, it does
            // not have to be, if JSON is not further embedded somewhere
            // where forward slash is meaningful.
            if ( c == '"' ) {
                m_os << "\\\"";
            } else if ( c == '\\' ) {
                m_os << "\\\\";
            } else if ( c == '\b' ) {
                m_os << "\\b";
            } else if ( c == '\f' ) {
                m_os << "\\f";
            } else if ( c == '\n' ) {
                m_os << "\\n";
            } else if ( c == '\r' ) {
                m_os << "\\r";
            } else if ( c == '\t' ) {
                m_os << "\\t";
            } else {
                m_os << c;
            }
        }
        if ( quote ) { m_os << '"'; }
    }